

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

void mkroom(level *lev,int roomtype)

{
  byte bVar1;
  int *piVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  char *__s2;
  long lVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  int shp_indx;
  long lVar10;
  char *pcVar11;
  int *piVar12;
  mkroom *sroom;
  bool bVar13;
  int iStack_40;
  
  if (roomtype < 0x12) {
    switch(roomtype) {
    case 2:
switchD_001d7d27_caseD_54:
      iStack_40 = 2;
      goto LAB_001d7d61;
    case 3:
switchD_001d7d27_caseD_7d:
      mkswamp(lev);
      return;
    default:
      impossible("Tried to make a room of type %d.");
      return;
    case 5:
switchD_001d7d27_caseD_42:
      iStack_40 = 5;
      goto LAB_001d7d61;
    case 6:
switchD_001d7d27_caseD_4d:
      iStack_40 = 6;
      goto LAB_001d7d61;
    case 7:
switchD_001d7d27_caseD_53:
      iStack_40 = 7;
      goto LAB_001d7d61;
    case 8:
switchD_001d7d27_caseD_5a:
      iStack_40 = 8;
      goto LAB_001d7d61;
    case 10:
switchD_001d7d27_caseD_5f:
      mktemple(lev);
      return;
    case 0xb:
switchD_001d7d27_caseD_4c:
      iStack_40 = 0xb;
      goto LAB_001d7d61;
    case 0xc:
switchD_001d7d27_caseD_43:
      iStack_40 = 0xc;
      goto LAB_001d7d61;
    case 0xd:
      goto switchD_001d7d27_caseD_41;
    case 0xe:
switchD_001d7d27_caseD_6e:
      mkgarden(lev,(mkroom *)0x0);
      return;
    case 0xf:
switchD_001d7d27_caseD_52:
      iStack_40 = 0xf;
      goto LAB_001d7d61;
    case 0x10:
switchD_001d7d27_caseD_50:
      iStack_40 = 0x10;
      goto LAB_001d7d61;
    case 0x11:
switchD_001d7d27_caseD_4f:
      mkpoolroom(lev);
      return;
    }
  }
  if (flags.debug != '\0') {
    __s2 = nh_getenv("SHOPTYPE");
    shp_indx = 0;
    if (__s2 != (char *)0x0) {
      for (pcVar11 = &shtypes[0].symb; ((shclass *)(pcVar11 + -8))->name != (char *)0x0;
          pcVar11 = pcVar11 + 0xc0) {
        iVar4 = strcmp(((shclass *)(pcVar11 + -8))->name,__s2);
        bVar1 = 1;
        if ((iVar4 == 0) || (*__s2 == ""[*pcVar11])) goto switchD_001d7d27_caseD_44;
        shp_indx = shp_indx + 1;
      }
      bVar1 = 1;
      shp_indx = -1;
      switch(*__s2) {
      case 'A':
      case 'a':
switchD_001d7d27_caseD_41:
        iStack_40 = 0xd;
LAB_001d7d61:
        mkzoo(lev,iStack_40);
        return;
      case 'B':
      case 'b':
        goto switchD_001d7d27_caseD_42;
      case 'C':
      case 'c':
        goto switchD_001d7d27_caseD_43;
      case 'G':
      case 'g':
        shp_indx = 0;
        break;
      case 'L':
      case 'l':
        goto switchD_001d7d27_caseD_4c;
      case 'M':
      case 'm':
        goto switchD_001d7d27_caseD_4d;
      case 'O':
      case 'o':
        goto switchD_001d7d27_caseD_4f;
      case 'P':
      case 'p':
        goto switchD_001d7d27_caseD_50;
      case 'R':
      case 'r':
        goto switchD_001d7d27_caseD_52;
      case 'S':
      case 's':
        goto switchD_001d7d27_caseD_53;
      case 'T':
      case 't':
        goto switchD_001d7d27_caseD_54;
      case 'Z':
      case 'z':
        goto switchD_001d7d27_caseD_5a;
      case '_':
        goto switchD_001d7d27_caseD_5f;
      case 'n':
        goto switchD_001d7d27_caseD_6e;
      case '}':
        goto switchD_001d7d27_caseD_7d;
      }
      goto switchD_001d7d27_caseD_44;
    }
  }
  bVar1 = 0;
  shp_indx = -1;
switchD_001d7d27_caseD_44:
  sroom = lev->rooms;
  bVar13 = flags.debug != '\0';
  lVar6 = 0;
  do {
    cVar9 = sroom->hx;
    if (cVar9 < '\0') {
      return;
    }
    if ((long)lev->nroom <= lVar6 / 0xd8) {
      pline("lev->rooms not closed by -1?");
      return;
    }
    if (((sroom->rtype == '\0') && (bVar3 = has_dnstairs(lev,sroom), bVar3 == '\0')) &&
       (bVar3 = has_upstairs(lev,sroom), bVar3 == '\0')) {
      if ((bool)(bVar13 & bVar1)) {
        if (sroom->doorct != '\0') {
LAB_001d7dd8:
          if (sroom->rlit == '\0') {
            lVar7 = (long)lev + (long)sroom->lx * 0xfc + -0xc2;
            for (lVar6 = (long)sroom->lx + -1; lVar6 <= (long)cVar9 + 1; lVar6 = lVar6 + 1) {
              lVar10 = (long)sroom->ly * 0xc + lVar7;
              for (lVar8 = (long)sroom->ly + -1; lVar8 <= (long)sroom->hy + 1; lVar8 = lVar8 + 1) {
                *(byte *)(lVar10 + 1) = *(byte *)(lVar10 + 1) | 4;
                lVar10 = lVar10 + 0xc;
              }
              cVar9 = sroom->hx;
              lVar7 = lVar7 + 0xfc;
            }
            sroom->rlit = '\x01';
          }
          if (shp_indx < 0) {
            iVar4 = rnd(100);
            shp_indx = -1;
            piVar2 = &shtypes[0].prob;
            do {
              piVar12 = piVar2;
              shp_indx = shp_indx + 1;
              iVar5 = iVar4 - *piVar12;
              bVar13 = *piVar12 <= iVar4;
              piVar2 = piVar12 + 0x30;
              iVar4 = iVar5;
            } while (iVar5 != 0 && bVar13);
            if ((0x14 < (((int)sroom->hy - (int)sroom->ly) + 1) *
                        (((int)sroom->hx - (int)sroom->lx) + 1)) &&
               ((*(byte *)(piVar12 + -1) & 0xfe) == 10)) {
              shp_indx = 0;
            }
          }
          sroom->rtype = (char)shp_indx + '\x12';
          topologize(lev,sroom);
          stock_room(shp_indx,lev,sroom);
          return;
        }
      }
      else if (sroom->doorct == '\x01') goto LAB_001d7dd8;
    }
    sroom = sroom + 1;
    lVar6 = lVar6 + 0xd8;
  } while( true );
}

Assistant:

void mkroom(struct level *lev, int roomtype)
{
    if (roomtype >= SHOPBASE)
	mkshop(lev);	/* someday, we should be able to specify shop type */
    else switch(roomtype) {
	case COURT:	mkzoo(lev, COURT); break;
	case ZOO:	mkzoo(lev, ZOO); break;
	case BEEHIVE:	mkzoo(lev, BEEHIVE); break;
	case MORGUE:	mkzoo(lev, MORGUE); break;
	case BARRACKS:	mkzoo(lev, BARRACKS); break;
	case SWAMP:	mkswamp(lev); break;
	case GARDEN:	mkgarden(lev, NULL); break;
	case TEMPLE:	mktemple(lev); break;
	case LEPREHALL:	mkzoo(lev, LEPREHALL); break;
	case COCKNEST:	mkzoo(lev, COCKNEST); break;
	case ARMORY:	mkzoo(lev, ARMORY); break;
	case ANTHOLE:	mkzoo(lev, ANTHOLE); break;
	case LEMUREPIT:	mkzoo(lev, LEMUREPIT); break;
	case POOLROOM:	mkpoolroom(lev); break;
	default:	impossible("Tried to make a room of type %d.", roomtype);
    }
}